

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReporterFactory.cpp
# Opt level: O0

string * __thiscall
ApprovalTests::ReporterFactory::findReporterName
          (ReporterFactory *this,string *osPrefix,string *reporterName)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  reference pbVar2;
  pointer ppVar3;
  string *in_RCX;
  string *in_RDX;
  string *in_RDI;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>
  iter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *candidateName;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  candidateNames;
  string trimmedReporterName;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
  *in_stack_fffffffffffffd18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd30;
  anon_class_8_1_b9d968ce_for__M_pred in_stack_fffffffffffffd38;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>
  in_stack_fffffffffffffd40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd48;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>
  __first;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd50;
  _Rb_tree_node_base *p_Var4;
  iterator in_stack_fffffffffffffd58;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *paVar5;
  string *in_stack_fffffffffffffd78;
  string *this_00;
  _Self local_250;
  reference local_248;
  _Base_ptr local_240;
  _Base_ptr local_238;
  _Self local_230;
  string *in_stack_fffffffffffffdd8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_218;
  undefined1 *local_210;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_202;
  undefined1 local_201;
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  _Rb_tree_node_base *local_160;
  _Rb_tree_node_base local_158;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  _Rb_tree_node_base *local_d8;
  _Base_ptr local_d0;
  undefined1 local_c8 [24];
  string local_b0 [32];
  string local_90 [48];
  string local_60 [32];
  string local_40 [40];
  string *local_18;
  
  local_18 = in_RDX;
  ::std::__cxx11::string::string(local_60,in_RCX);
  StringUtils::trim(in_stack_fffffffffffffdd8);
  ::std::__cxx11::string::~string(local_60);
  ::std::__cxx11::string::string(local_b0,local_40);
  StringUtils::toLower(in_stack_fffffffffffffd78);
  this_00 = local_90;
  ::std::__cxx11::string::operator=(local_40,this_00);
  ::std::__cxx11::string::~string(this_00);
  ::std::__cxx11::string::~string(local_b0);
  local_201 = 1;
  local_160 = &local_158;
  ::std::__cxx11::string::string((string *)local_160,local_40);
  local_160 = (_Rb_tree_node_base *)local_138;
  ::std::operator+(in_stack_fffffffffffffd48,(char *)in_stack_fffffffffffffd40._M_node);
  local_160 = (_Rb_tree_node_base *)local_118;
  ::std::__cxx11::string::string(local_1a0,local_18);
  StringUtils::toLower((string *)this_00);
  ::std::operator+(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  local_160 = (_Rb_tree_node_base *)local_f8;
  ::std::__cxx11::string::string(local_200,local_18);
  StringUtils::toLower((string *)this_00);
  ::std::operator+(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  ::std::operator+(in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd20);
  local_201 = 0;
  local_d8 = &local_158;
  local_d0 = (_Base_ptr)0x4;
  paVar5 = &local_202;
  ::std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x124635);
  __l._M_len = (size_type)paVar5;
  __l._M_array = in_stack_fffffffffffffd58;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_fffffffffffffd50,__l,(allocator_type *)in_stack_fffffffffffffd48);
  ::std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~allocator(&local_202);
  p_Var4 = &local_158;
  __first._M_node = (_Base_ptr)&local_d8;
  do {
    __first._M_node = __first._M_node + -1;
    ::std::__cxx11::string::~string((string *)__first._M_node);
  } while (__first._M_node != p_Var4);
  ::std::__cxx11::string::~string(local_1c0);
  ::std::__cxx11::string::~string(local_1e0);
  ::std::__cxx11::string::~string(local_200);
  ::std::__cxx11::string::~string(local_180);
  ::std::__cxx11::string::~string(local_1a0);
  local_210 = local_c8;
  local_218._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ::std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffd18);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)in_stack_fffffffffffffd18);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffd20,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffd18);
    if (!bVar1) {
      ::std::__cxx11::string::string((string *)in_RDI);
LAB_00124a56:
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_fffffffffffffd30);
      ::std::__cxx11::string::~string(local_40);
      return in_RDI;
    }
    pbVar2 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_218);
    local_238 = (_Base_ptr)
                ::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
                ::begin(in_stack_fffffffffffffd18);
    local_240 = (_Base_ptr)
                ::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
                ::end(in_stack_fffffffffffffd18);
    local_248 = pbVar2;
    in_stack_fffffffffffffd40 =
         ::std::
         find_if<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::function<std::unique_ptr<ApprovalTests::Reporter,std::default_delete<ApprovalTests::Reporter>>()>>>,ApprovalTests::ReporterFactory::findReporterName(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                   (__first,in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    local_230._M_node = in_stack_fffffffffffffd40._M_node;
    local_250._M_node =
         (_Base_ptr)
         ::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
         ::end(in_stack_fffffffffffffd18);
    bVar1 = ::std::operator!=(&local_230,&local_250);
    if (bVar1) {
      ppVar3 = ::std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>
                             *)0x1247fe);
      ::std::__cxx11::string::string((string *)in_RDI,(string *)ppVar3);
      goto LAB_00124a56;
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_218);
  } while( true );
}

Assistant:

std::string ReporterFactory::findReporterName(const std::string& osPrefix,
                                                  const std::string& reporterName) const
    {
        auto trimmedReporterName = StringUtils::trim(reporterName);
        trimmedReporterName = StringUtils::toLower(trimmedReporterName);

        std::vector<std::string> candidateNames = {
            trimmedReporterName,
            // Allow program names to be specified without Reporter suffix
            trimmedReporterName + "reporter",
            // Allow names without os namespace
            StringUtils::toLower(osPrefix) + trimmedReporterName,
            StringUtils::toLower(osPrefix) + trimmedReporterName + "reporter",
        };

        for (auto& candidateName : candidateNames)
        {
            auto iter = std::find_if(
                map.begin(), map.end(), [&](const Reporters::value_type pair) {
                    return StringUtils::toLower(pair.first) == candidateName;
                });

            if (iter != map.end())
            {
                return iter->first;
            }
        }

        return std::string{};
    }